

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O3

void __thiscall MxxColl_ScattervGeneral_Test::TestBody(MxxColl_ScattervGeneral_Test *this)

{
  bool bVar1;
  int iVar2;
  char *message;
  void *pvVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  vector<int,_std::allocator<int>_> result;
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> vec;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes;
  comm c;
  Message local_d0;
  AssertHelper local_c8;
  vector<int,_std::allocator<int>_> local_c0;
  allocator_type local_a8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  vector<int,_std::allocator<int>_> local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  comm local_58;
  unsigned_long local_38;
  
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&ompi_mpi_comm_world;
  mxx::comm::comm(&local_58,(MPI_Comm *)&local_98);
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((local_58.m_rank == 0) &&
     (std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&local_78,(long)local_58.m_size), 0 < local_58.m_size)) {
    lVar5 = 1;
    iVar4 = 0;
    local_38 = 0;
    do {
      local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[local_38] = local_38 + 1;
      lVar6 = lVar5;
      iVar2 = iVar4;
      local_38 = local_38 + 1;
      do {
        local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = iVar2;
        if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_98,
                     (iterator)
                     local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_c0);
        }
        else {
          *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar2;
          local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        iVar2 = iVar2 + 2;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      lVar5 = lVar5 + 1;
      iVar4 = iVar4 + 3;
    } while ((long)local_38 < (long)local_58.m_size);
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_c0,(long)local_58.m_rank + 1,local_a8);
  mxx::scatterv<int>(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_78,
                     (int *)CONCAT44(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     (int)local_c0.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start),
                     (long)local_58.m_rank + 1,0,&local_58);
  pvVar3 = (void *)CONCAT44(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
  if (0 < (int)((ulong)((long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pvVar3) >> 2)) {
    lVar5 = 0;
    iVar4 = 0;
    lVar6 = 0;
    do {
      local_d0.ss_.ptr_._0_4_ = local_58.m_rank * 3 + iVar4;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_a8,"2*j+3*c.rank()","result[j]",(int *)&local_d0,
                 (int *)((long)pvVar3 + lVar5));
      if (local_a8[0] == (allocator_type)0x0) {
        testing::Message::Message(&local_d0);
        if (local_a0.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((local_a0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_collective.cpp"
                   ,0x93,message);
        testing::internal::AssertHelper::operator=(&local_c8,&local_d0);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if (((CONCAT44(local_d0.ss_.ptr_._4_4_,(int)local_d0.ss_.ptr_) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT44(local_d0.ss_.ptr_._4_4_,(int)local_d0.ss_.ptr_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_d0.ss_.ptr_._4_4_,(int)local_d0.ss_.ptr_) + 8))();
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pvVar3 = (void *)CONCAT44(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (int)local_c0.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start);
        break;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar6 = lVar6 + 1;
      pvVar3 = (void *)CONCAT44(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start);
      iVar4 = iVar4 + 2;
      lVar5 = lVar5 + 4;
    } while (lVar6 < (int)((ulong)((long)local_c0.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish - (long)pvVar3)
                          >> 2));
  }
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  mxx::comm::~comm(&local_58);
  return;
}

Assistant:

TEST(MxxColl, ScattervGeneral) {
    mxx::comm c = MPI_COMM_WORLD;

    std::vector<int> vec;
    std::vector<size_t> sizes;

    // scatter from 0
    if (c.rank() == 0) {
        sizes.resize(c.size());
        for (int i = 0; i < c.size(); ++i) {
            sizes[i] = i+1;
            for (size_t j = 0; j < (size_t)(i+1); ++j)
            {
                vec.push_back(2*j + 3*i);
            }
        }
    }

    // test general case
    std::vector<int> result(c.rank()+1);
    mxx::scatterv(&vec[0], sizes, &result.front(), c.rank()+1, 0, c);
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(2*j+3*c.rank(), result[j]);
    }
}